

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O0

t_int * phasor_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  t_float conv;
  int normhipart;
  tabfudge tf;
  double dphase;
  float *pfStack_28;
  int n;
  t_sample *out;
  t_sample *in;
  t_phasor *x;
  t_int *w_local;
  
  lVar2 = w[1];
  tf.tf_d = *(double *)(lVar2 + 0x30) + 1572864.0;
  fVar1 = *(float *)(lVar2 + 0x38);
  dphase._4_4_ = (int)w[4];
  pfStack_28 = (float *)w[3];
  out = (t_sample *)w[2];
  while (conv = tf.tf_i[0], dphase._4_4_ != 0) {
    _conv = (double)CONCAT44(0x41380000,conv);
    tf.tf_d = (double)(*out * fVar1) + tf.tf_d;
    *pfStack_28 = (float)(_conv - 1572864.0);
    dphase._4_4_ = dphase._4_4_ + -1;
    pfStack_28 = pfStack_28 + 1;
    out = out + 1;
  }
  _conv = (double)CONCAT44(0x41380000,conv);
  *(double *)(lVar2 + 0x30) = _conv - 1572864.0;
  return w + 5;
}

Assistant:

static t_int *phasor_perform(t_int *w)
{
    t_phasor *x = (t_phasor *)(w[1]);
    t_sample *in = (t_float *)(w[2]);
    t_sample *out = (t_float *)(w[3]);
    int n = (int)(w[4]);
    double dphase = x->x_phase + (double)UNITBIT32;
    union tabfudge tf;
    int normhipart;
    t_float conv = x->x_conv;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];
    tf.tf_d = dphase;

    while (n--)
    {
        tf.tf_i[HIOFFSET] = normhipart;
        dphase += *in++ * conv;
        *out++ = tf.tf_d - UNITBIT32;
        tf.tf_d = dphase;
    }
    tf.tf_i[HIOFFSET] = normhipart;
    x->x_phase = tf.tf_d - UNITBIT32;
    return (w+5);
}